

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::DeadStoreInstr(BackwardPass *this,Instr *instr)

{
  int iVar1;
  BasicBlock *this_00;
  Type TVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  ArgSlot AVar6;
  RegSlot RVar7;
  undefined4 *puVar8;
  StackSym *pSVar9;
  Func *pFVar10;
  StackSym **ppSVar11;
  SymOpnd *pSVar12;
  JITTimeFunctionBody *this_01;
  uint index;
  PropertySym *local_a0;
  PropertySym *unusedPropertySym;
  BVSparse<Memory::JitArenaAllocator> tempBv;
  BVSparse<Memory::JitArenaAllocator> tempBv2;
  BVUnitT<unsigned_long> local_40;
  SparseBVUnit _unit;
  
  this_00 = this->currentBlock;
  bVar5 = IsTraceEnabled(this);
  if (bVar5) {
    Output::Print(L"Deadstore instr: ");
    IR::Instr::Dump(instr);
  }
  this->numDeadStore = this->numDeadStore + 1;
  bVar5 = DoByteCodeUpwardExposedUsed(this);
  if (bVar5) {
    tempBv.lastFoundIndex = (Type_conflict)this->tempAlloc;
    tempBv.alloc = (Type)&unusedPropertySym;
    unusedPropertySym = (PropertySym *)0x0;
    tempBv.head = (Type_conflict)0x0;
    BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
              ((BVSparse<Memory::JitArenaAllocator> *)tempBv.alloc,
               this->currentBlock->byteCodeUpwardExposedUsed);
    local_a0 = (PropertySym *)0x0;
    GlobOpt::TrackByteCodeSymUsed(instr,this->currentBlock->byteCodeUpwardExposedUsed,&local_a0);
    tempBv.lastUsedNodePrevNextField = (Type)0x0;
    BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv.lastUsedNodePrevNextField,
               this->currentBlock->byteCodeUpwardExposedUsed);
    _unit.word = (Type)&tempBv.lastUsedNodePrevNextField;
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((BVSparse<Memory::JitArenaAllocator> *)_unit.word,
               (BVSparse<Memory::JitArenaAllocator> *)&unusedPropertySym);
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while (TVar2 = *_unit.word, TVar2 != 0) {
      iVar1 = *(int *)(TVar2 + 8);
      local_40.word = *(ulong *)(TVar2 + 0x10);
      _unit.word = TVar2;
      while ((LPCWSTR)local_40.word != (LPCWSTR)0x0) {
        lVar3 = 0;
        if ((LPCWSTR)local_40.word != (LPCWSTR)0x0) {
          for (; (local_40.word >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        index = -(uint)((LPCWSTR)local_40.word == (LPCWSTR)0x0) | (uint)lVar3;
        BVUnitT<unsigned_long>::Clear(&local_40,index);
        pSVar9 = SymTable::FindStackSym(this->func->m_symTable,index + iVar1);
        if (pSVar9->m_type != TyVar) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1f55,"(stackSym->GetType() == TyVar)","stackSym->GetType() == TyVar"
                            );
          if (!bVar5) goto LAB_003d4f96;
          *puVar8 = 0;
        }
        pFVar10 = StackSym::GetByteCodeFunc(pSVar9);
        if (pFVar10 == this->func) {
          RVar7 = StackSym::GetByteCodeRegSlot(pSVar9);
          if (RVar7 == 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1f5a,"(byteCodeRegSlot != Js::Constants::NoRegister)",
                               "byteCodeRegSlot != Js::Constants::NoRegister");
            if (!bVar5) goto LAB_003d4f96;
            *puVar8 = 0;
          }
          ppSVar11 = this->currentBlock->byteCodeRestoreSyms;
          if (ppSVar11[RVar7] != pSVar9) {
            if (ppSVar11[RVar7] != (StackSym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1f5e,
                                 "(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)"
                                 ,"Can\'t have two active lifetime for the same byte code register")
              ;
              if (!bVar5) goto LAB_003d4f96;
              *puVar8 = 0;
              ppSVar11 = this->currentBlock->byteCodeRestoreSyms;
            }
            ppSVar11[RVar7] = pSVar9;
          }
        }
      }
    }
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&tempBv.lastUsedNodePrevNextField);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&unusedPropertySym);
  }
  if (this->preOpBailOutInstrToProcess != instr && this->preOpBailOutInstrToProcess != (Instr *)0x0)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1f69,
                       "(!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr)",
                       "!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr");
    if (!bVar5) goto LAB_003d4f96;
    *puVar8 = 0;
  }
  this->preOpBailOutInstrToProcess = (Instr *)0x0;
  bVar5 = DoMarkTempObjectVerify(this);
  if (bVar5) {
    ObjectTempVerify::NotifyDeadStore
              (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,instr,this);
  }
  if (instr->m_opcode == ArgIn_A) {
    pSVar12 = IR::Opnd::AsSymOpnd(instr->m_src1);
    pSVar9 = Sym::AsStackSym(pSVar12->m_sym);
    AVar6 = StackSym::GetParamSlotNum(pSVar9);
    if (AVar6 == 1) {
      this_01 = Func::GetJITFunctionBody(this->func);
      bVar5 = JITTimeFunctionBody::IsAsmJsMode(this_01);
      if (!bVar5) goto LAB_003d4f72;
    }
    pFVar10 = this->func;
    AVar6 = pFVar10->argInsCount;
    if (AVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1f7a,"(this->func->argInsCount > 0)","this->func->argInsCount > 0");
      if (!bVar5) {
LAB_003d4f96:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
      pFVar10 = this->func;
      AVar6 = pFVar10->argInsCount;
    }
    pFVar10->argInsCount = AVar6 - 1;
  }
LAB_003d4f72:
  TraceDeadStoreOfInstrsForScopeObjectRemoval(this);
  BasicBlock::RemoveInstr(this_00,instr);
  return true;
}

Assistant:

bool
BackwardPass::DeadStoreInstr(IR::Instr *instr)
{
    BasicBlock * block = this->currentBlock;

#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("Deadstore instr: "));
        instr->Dump();
    }
    this->numDeadStore++;
#endif

    // Before we remove the dead store, we need to track the byte code uses
    if (this->DoByteCodeUpwardExposedUsed())
    {
#if DBG
        BVSparse<JitArenaAllocator> tempBv(this->tempAlloc);
        tempBv.Copy(this->currentBlock->byteCodeUpwardExposedUsed);
#endif
        PropertySym *unusedPropertySym = nullptr;

        GlobOpt::TrackByteCodeSymUsed(instr, this->currentBlock->byteCodeUpwardExposedUsed, &unusedPropertySym);

#if DBG
        BVSparse<JitArenaAllocator> tempBv2(this->tempAlloc);
        tempBv2.Copy(this->currentBlock->byteCodeUpwardExposedUsed);
        tempBv2.Minus(&tempBv);
        FOREACH_BITSET_IN_SPARSEBV(symId, &tempBv2)
        {
            StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
            Assert(stackSym->GetType() == TyVar);
            // TODO: We can only track first level function stack syms right now
            if (stackSym->GetByteCodeFunc() == this->func)
            {
                Js::RegSlot byteCodeRegSlot = stackSym->GetByteCodeRegSlot();
                Assert(byteCodeRegSlot != Js::Constants::NoRegister);
                if (this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] != stackSym)
                {
                    AssertMsg(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                        "Can't have two active lifetime for the same byte code register");
                    this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] = stackSym;
                }
            }
        }
        NEXT_BITSET_IN_SPARSEBV;
#endif
    }

    // If this is a pre-op bailout instruction, we may have saved it for bailout info processing. It's being removed now, so no
    // need to process the bailout info anymore.
    Assert(!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr);
    preOpBailOutInstrToProcess = nullptr;

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        this->currentBlock->tempObjectVerifyTracker->NotifyDeadStore(instr, this);
    }
#endif


    if (instr->m_opcode == Js::OpCode::ArgIn_A)
    {
        // Ignore tracking ArgIn for "this" as argInsCount only tracks other
        // params, unless it is a AsmJS function (which doesn't have a "this").
        if (instr->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() != 1 || func->GetJITFunctionBody()->IsAsmJsMode())
        {
            Assert(this->func->argInsCount > 0);
            this->func->argInsCount--;
        }
    }

    TraceDeadStoreOfInstrsForScopeObjectRemoval();

    block->RemoveInstr(instr);
    return true;
}